

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

void __thiscall Parser::get_lex(Parser *this)

{
  Lex *this_00;
  Lex *pLVar1;
  lex_t lVar2;
  int iVar3;
  ostream *poVar4;
  
  pLVar1 = (this->index)._M_current;
  this_00 = &this->c_lex;
  iVar3 = pLVar1->value;
  (this->c_lex).type = pLVar1->type;
  (this->c_lex).value = iVar3;
  (this->c_lex).add_value = pLVar1->add_value;
  lVar2 = Lex::get_type(this_00);
  this->c_type = lVar2;
  iVar3 = Lex::get_value(this_00);
  this->c_val = iVar3;
  iVar3 = Lex::get_add_value(this_00);
  this->c_add_val = iVar3;
  (this->index)._M_current = (this->index)._M_current + 1;
  if (DEBUG_MODE != 0) {
    poVar4 = operator<<((ostream *)&std::cout,this_00);
    std::endl<char,std::char_traits<char>>(poVar4);
    return;
  }
  return;
}

Assistant:

void Parser::get_lex() {
    c_lex = *index;
    c_type = c_lex.get_type();
    c_val = c_lex.get_value();
    c_add_val = c_lex.get_add_value();
    ++index;
    if (DEBUG_MODE)
        cout << c_lex << endl;
}